

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O1

void __thiscall
duckdb::DependencyManager::Scan
          (DependencyManager *this,ClientContext *context,
          function<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&)>
          *callback)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  int iVar1;
  mutex *__mutex;
  __node_base _Var2;
  CatalogTransaction transaction;
  CatalogEntryInfo entry_info;
  catalog_entry_set_t entries;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  CatalogTransaction local_e0;
  _Any_data local_b8;
  code *local_a8;
  code *apcStack_a0 [2];
  char *local_90;
  char local_80 [24];
  _Hashtable<std::reference_wrapper<duckdb::CatalogEntry>,_std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>,_std::__detail::_Identity,_duckdb::CatalogEntryEquality,_duckdb::CatalogEntryHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  CatalogTransaction::CatalogTransaction(&local_e0,&this->catalog->super_Catalog,context);
  __mutex = &this->catalog->write_lock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_a8 = (code *)0x0;
    apcStack_a0[0] = (code *)0x0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = (code **)0x0;
    local_b8._M_unused._M_object = operator_new(0x18);
    *(DependencyManager **)local_b8._M_unused._0_8_ = this;
    *(CatalogTransaction **)((long)local_b8._M_unused._0_8_ + 8) = &local_e0;
    *(_Hashtable<std::reference_wrapper<duckdb::CatalogEntry>,_std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>,_std::__detail::_Identity,_duckdb::CatalogEntryEquality,_duckdb::CatalogEntryHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      **)((long)local_b8._M_unused._0_8_ + 0x10) = &local_68;
    apcStack_a0[0] =
         ::std::
         _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:708:31)>
         ::_M_invoke;
    local_a8 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:708:31)>
               ::_M_manager;
    transaction_00.context.ptr = local_e0.context.ptr;
    transaction_00.db.ptr = local_e0.db.ptr;
    transaction_00.transaction.ptr = local_e0.transaction.ptr;
    transaction_00.transaction_id = local_e0.transaction_id;
    transaction_00.start_time = local_e0.start_time;
    CatalogSet::Scan(&this->dependents,transaction_00,
                     (function<void_(duckdb::CatalogEntry_&)> *)&local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var2._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        GetLookupProperties((CatalogEntryInfo *)&local_b8,(CatalogEntry *)_Var2._M_nxt[1]._M_nxt);
        local_f8 = (code *)0x0;
        pcStack_f0 = (code *)0x0;
        local_108._M_unused._M_object = (void *)0x0;
        local_108._8_8_ = 0;
        local_108._M_unused._M_object = operator_new(0x20);
        *(DependencyManager **)local_108._M_unused._0_8_ = this;
        *(CatalogTransaction **)((long)local_108._M_unused._0_8_ + 8) = &local_e0;
        *(function<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&)>
          **)((long)local_108._M_unused._0_8_ + 0x10) = callback;
        *(_Hash_node_base **)((long)local_108._M_unused._0_8_ + 0x18) = _Var2._M_nxt + 1;
        pcStack_f0 = ::std::
                     _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:717:43)>
                     ::_M_invoke;
        local_f8 = ::std::
                   _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:717:43)>
                   ::_M_manager;
        transaction_01.context.ptr = local_e0.context.ptr;
        transaction_01.db.ptr = local_e0.db.ptr;
        transaction_01.transaction.ptr = local_e0.transaction.ptr;
        transaction_01.transaction_id = local_e0.transaction_id;
        transaction_01.start_time = local_e0.start_time;
        ScanSetInternal(this,transaction_01,(CatalogEntryInfo *)&local_b8,false,
                        (dependency_callback_t *)&local_108);
        if (local_f8 != (code *)0x0) {
          (*local_f8)(&local_108,&local_108,__destroy_functor);
        }
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        if ((code **)local_b8._8_8_ != apcStack_a0) {
          operator_delete((void *)local_b8._8_8_);
        }
        _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt;
      } while (_Var2._M_nxt != (_Hash_node_base *)0x0);
    }
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::CatalogEntry>,_std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>,_std::__detail::_Identity,_duckdb::CatalogEntryEquality,_duckdb::CatalogEntryHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void DependencyManager::Scan(
    ClientContext &context,
    const std::function<void(CatalogEntry &, CatalogEntry &, const DependencyDependentFlags &)> &callback) {
	auto transaction = catalog.GetCatalogTransaction(context);
	lock_guard<mutex> write_lock(catalog.GetWriteLock());

	// All the objects registered in the dependency manager
	catalog_entry_set_t entries;
	dependents.Scan(transaction, [&](CatalogEntry &set) {
		auto entry = LookupEntry(transaction, set);
		entries.insert(*entry);
	});

	// For every registered entry, get the dependents
	for (auto &entry : entries) {
		auto entry_info = GetLookupProperties(entry);
		// Scan all the dependents of the entry
		ScanDependents(transaction, entry_info, [&](DependencyEntry &dependent) {
			auto dep = LookupEntry(transaction, dependent);
			if (!dep) {
				return;
			}
			auto &dependent_entry = *dep;
			callback(entry, dependent_entry, dependent.Dependent().flags);
		});
	}
}